

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

void __thiscall
spirv_cross::SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
          (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *this,size_t count)

{
  ID IVar1;
  uint32_t uVar2;
  undefined3 uVar3;
  size_t sVar4;
  unsigned_long uVar5;
  unsigned_long *puVar6;
  Parameter *pPVar7;
  Parameter *pPVar8;
  Parameter *local_60;
  ulong local_38;
  size_t i;
  Parameter *new_buffer;
  unsigned_long local_20;
  size_t target_capacity;
  size_t count_local;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *this_local;
  
  target_capacity = count;
  count_local = (size_t)this;
  uVar5 = ::std::numeric_limits<unsigned_long>::max();
  sVar4 = target_capacity;
  if ((uVar5 / 0x14 < count) ||
     (uVar5 = ::std::numeric_limits<unsigned_long>::max(), uVar5 >> 1 < sVar4)) {
    ::std::terminate();
  }
  if (this->buffer_capacity < target_capacity) {
    local_20 = this->buffer_capacity;
    if (local_20 == 0) {
      local_20 = 1;
    }
    new_buffer = (Parameter *)0x8;
    puVar6 = ::std::max<unsigned_long>(&local_20,(unsigned_long *)&new_buffer);
    for (local_20 = *puVar6; local_20 < target_capacity; local_20 = local_20 << 1) {
    }
    if (local_20 < 9) {
      local_60 = AlignedBuffer<spirv_cross::SPIRFunction::Parameter,_8UL>::data
                           (&this->stack_storage);
    }
    else {
      local_60 = (Parameter *)malloc(local_20 * 0x14);
    }
    if (local_60 == (Parameter *)0x0) {
      ::std::terminate();
    }
    if (local_60 != (this->super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr) {
      for (local_38 = 0;
          local_38 < (this->super_VectorView<spirv_cross::SPIRFunction::Parameter>).buffer_size;
          local_38 = local_38 + 1) {
        pPVar7 = local_60 + local_38;
        pPVar8 = (this->super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr + local_38;
        IVar1.id = (pPVar8->id).id;
        pPVar7->type = (TypeID)(pPVar8->type).id;
        pPVar7->id = (ID)IVar1.id;
        uVar2 = pPVar8->write_count;
        pPVar7->read_count = pPVar8->read_count;
        pPVar7->write_count = uVar2;
        uVar3 = *(undefined3 *)&pPVar8->field_0x11;
        pPVar7->alias_global_variable = pPVar8->alias_global_variable;
        *(undefined3 *)&pPVar7->field_0x11 = uVar3;
      }
    }
    pPVar7 = (this->super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr;
    pPVar8 = AlignedBuffer<spirv_cross::SPIRFunction::Parameter,_8UL>::data(&this->stack_storage);
    if (pPVar7 != pPVar8) {
      free((this->super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr);
    }
    (this->super_VectorView<spirv_cross::SPIRFunction::Parameter>).ptr = local_60;
    this->buffer_capacity = local_20;
  }
  return;
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}